

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.h
# Opt level: O0

node<adj_ribs_in_data> *
add_prefix<adj_ribs_in_data>
          (node<adj_ribs_in_data> *root,uint32_t prefix,uint8_t prefix_len,adj_ribs_in_data data,
          bool *is_updated)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  node<adj_ribs_in_data> *pnVar4;
  undefined1 *puVar5;
  void *pvVar6;
  node<adj_ribs_in_data> *new_prefix;
  node<adj_ribs_in_data> *growth_node;
  node<adj_ribs_in_data> **growth_address_ptr;
  node<adj_ribs_in_data> *pnStack_28;
  uint8_t current_prefix_len;
  node<adj_ribs_in_data> *current;
  bool *is_updated_local;
  uint8_t prefix_len_local;
  uint32_t prefix_local;
  node<adj_ribs_in_data> *root_local;
  
  pnStack_28 = search_prefix<adj_ribs_in_data>(root,prefix,prefix_len + 0xff,false);
  for (growth_address_ptr._7_1_ = pnStack_28->prefix_len;
      (int)(uint)growth_address_ptr._7_1_ < (int)(prefix_len - 1);
      growth_address_ptr._7_1_ = growth_address_ptr._7_1_ + 1) {
    bVar3 = check_bit(prefix,growth_address_ptr._7_1_);
    if (bVar3) {
      growth_node = (node<adj_ribs_in_data> *)&pnStack_28->node_1;
    }
    else {
      growth_node = (node<adj_ribs_in_data> *)&pnStack_28->node_0;
    }
    lVar1._0_1_ = growth_node->is_prefix;
    lVar1._1_3_ = *(undefined3 *)&growth_node->field_0x1;
    lVar1._4_4_ = growth_node->prefix;
    if (lVar1 == 0) {
      pnVar4 = (node<adj_ribs_in_data> *)malloc(0x30);
      if (pnVar4 == (node<adj_ribs_in_data> *)0x0) {
        printf("Failed to allocate memory\n");
        exit(1);
      }
      pnVar4->is_prefix = false;
      pnVar4->prefix = pnStack_28->prefix;
      pnVar4->prefix_len = growth_address_ptr._7_1_ + 1;
      pnVar4->parent = pnStack_28;
      pnVar4->node_0 = (node<adj_ribs_in_data> *)0x0;
      pnVar4->node_1 = (node<adj_ribs_in_data> *)0x0;
      bVar3 = check_bit(prefix,growth_address_ptr._7_1_);
      if (bVar3) {
        pnVar4->prefix = 1 << (0x20 - (growth_address_ptr._7_1_ + 1) & 0x1f) | pnVar4->prefix;
        pnStack_28->node_1 = pnVar4;
        pnStack_28 = pnVar4;
      }
      else {
        pnStack_28->node_0 = pnVar4;
        pnStack_28 = pnVar4;
      }
    }
    else {
      pnStack_28 = *(node<adj_ribs_in_data> **)growth_node;
    }
  }
  bVar3 = check_bit(prefix,prefix_len + 0xff);
  if (bVar3) {
    growth_node = (node<adj_ribs_in_data> *)&pnStack_28->node_1;
  }
  else {
    growth_node = (node<adj_ribs_in_data> *)&pnStack_28->node_0;
  }
  lVar2._0_1_ = growth_node->is_prefix;
  lVar2._1_3_ = *(undefined3 *)&growth_node->field_0x1;
  lVar2._4_4_ = growth_node->prefix;
  if (lVar2 == 0) {
    puVar5 = (undefined1 *)malloc(0x30);
    if (puVar5 == (undefined1 *)0x0) {
      printf("Failed to allocate memory\n");
      exit(1);
    }
    *puVar5 = 1;
    *(uint32_t *)(puVar5 + 4) = pnStack_28->prefix;
    bVar3 = check_bit(prefix,prefix_len + 0xff);
    if (bVar3) {
      *(uint *)(puVar5 + 4) = 1 << (0x20 - prefix_len & 0x1f) | *(uint *)(puVar5 + 4);
    }
    puVar5[8] = prefix_len;
    pvVar6 = malloc(0x118);
    *(void **)(puVar5 + 0x10) = pvVar6;
    if (*(long *)(puVar5 + 0x10) == 0) {
      printf("Failed to allocate memory\n");
      exit(1);
    }
    memcpy(*(void **)(puVar5 + 0x10),&data,0x118);
    *(node<adj_ribs_in_data> **)(puVar5 + 0x18) = pnStack_28;
    *(undefined8 *)(puVar5 + 0x20) = 0;
    *(undefined8 *)(puVar5 + 0x28) = 0;
    *(undefined1 **)growth_node = puVar5;
    if (is_updated != (bool *)0x0) {
      *is_updated = false;
    }
  }
  else {
    if ((**(byte **)growth_node & 1) == 0) {
      **(undefined1 **)growth_node = 1;
      if (is_updated != (bool *)0x0) {
        *is_updated = false;
      }
    }
    else if (is_updated != (bool *)0x0) {
      *is_updated = true;
    }
    if (*(long *)(*(long *)growth_node + 0x10) == 0) {
      pvVar6 = malloc(0x118);
      *(void **)(*(long *)growth_node + 0x10) = pvVar6;
      if (*(long *)(*(long *)growth_node + 0x10) == 0) {
        printf("Failed to allocate memory\n");
        exit(1);
      }
    }
    memcpy(*(void **)(*(long *)growth_node + 0x10),&data,0x118);
  }
  return *(node<adj_ribs_in_data> **)growth_node;
}

Assistant:

node<DATA_TYPE>* add_prefix(node<DATA_TYPE>* root, uint32_t prefix, uint8_t prefix_len, DATA_TYPE data, bool* is_updated = nullptr){
    node<DATA_TYPE>* current = search_prefix(root, prefix, prefix_len-1);
    uint8_t current_prefix_len = current->prefix_len;
#ifdef TEST_RIB_TREE_TEST_TREE
    printf("Get prefix: %d\n", current_prefix_len);
#endif
    node<DATA_TYPE>** growth_address_ptr;
    while(current_prefix_len < prefix_len - 1){ // 枝を伸ばす
        if(check_bit(prefix, current_prefix_len)){
            growth_address_ptr = &current->node_1;
        }else{
            growth_address_ptr = &current->node_0;
        }
        if((*growth_address_ptr) != nullptr){
            current = *growth_address_ptr;
        }else{
            auto* growth_node = (node<DATA_TYPE>*) malloc(sizeof(node<DATA_TYPE>));
            if(growth_node == nullptr){
                printf("Failed to allocate memory\n");
                exit(EXIT_FAILURE);
            }
            growth_node->is_prefix = false;
            growth_node->prefix = current->prefix;
            growth_node->prefix_len = current_prefix_len+1;
            growth_node->parent = current;
            growth_node->node_0 = nullptr;
            growth_node->node_1 = nullptr;
            if(check_bit(prefix, current_prefix_len)){
                growth_node->prefix |= (0b01 << (32 - (current_prefix_len + 1)));
                current->node_1 = growth_node;
            }else{
                current->node_0 = growth_node;
            }
#ifdef TEST_RIB_TREE_TEST_TREE
            printf("Create: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(growth_node->prefix)}), current_prefix_len+1, growth_node);
#endif
            current = growth_node;
        }
        current_prefix_len++;
    }

    if(check_bit(prefix, prefix_len - 1)){
        growth_address_ptr = &current->node_1;
    }else{
        growth_address_ptr = &current->node_0;
    }
    if((*growth_address_ptr) == nullptr){
        auto* new_prefix = (node<DATA_TYPE>*) malloc(sizeof(node<DATA_TYPE>));
        if(new_prefix == nullptr){
            printf("Failed to allocate memory\n");
            exit(EXIT_FAILURE);
        }
        new_prefix->is_prefix = true;
        new_prefix->prefix = current->prefix;
        if(check_bit(prefix, prefix_len-1)){
            new_prefix->prefix |= (0b01 << (32 - prefix_len));
        }
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Create Prefix: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(new_prefix->prefix)}), prefix_len, new_prefix);
#endif
        new_prefix->prefix_len = prefix_len;
        new_prefix->data = (DATA_TYPE*) malloc(sizeof(DATA_TYPE));
        if(new_prefix->data == nullptr){
            printf("Failed to allocate memory\n");
            exit(EXIT_FAILURE);
        }
        memcpy(new_prefix->data, &data, sizeof(DATA_TYPE));
        new_prefix->parent = current;
        new_prefix->node_0 = nullptr;
        new_prefix->node_1 = nullptr;
        *growth_address_ptr = new_prefix;
        if(is_updated != nullptr){
            *is_updated = false;
        }
    }else{
#ifdef TEST_RIB_TREE_TEST_TREE
        printf("Exist: %s/%d, %p\n", inet_ntoa(in_addr{.s_addr = htonl(prefix)}), prefix_len, (*growth_address_ptr));
#endif
        if((*growth_address_ptr)->is_prefix){
            if(is_updated != nullptr){
                *is_updated = true; // 書き込み先のノードがもともとプレフィックスだったら、それは経路の更新である
            }
        }else{
            (*growth_address_ptr)->is_prefix = true;
            if(is_updated != nullptr){
                *is_updated = false; // 書き込み先のノードがもともとプレフィックスでなかったら、それは経路の追加である
            }
        }
        if((*growth_address_ptr)->data == nullptr){
            (*growth_address_ptr)->data = (DATA_TYPE*) malloc(sizeof(DATA_TYPE));
            if((*growth_address_ptr)->data == nullptr){
                printf("Failed to allocate memory\n");
                exit(EXIT_FAILURE);
            }
        }
        memcpy((*growth_address_ptr)->data, &data, sizeof(DATA_TYPE));
    }

    return *growth_address_ptr;
}